

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ushort uVar1;
  int iVar2;
  MeshType mt;
  DataType DVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  char *pcVar8;
  PtexMetaData *meta;
  ushort *puVar9;
  void *data;
  uint uVar10;
  char cVar11;
  uint uVar12;
  char cVar13;
  PtexPtr<Ptex::v2_2::PtexTexture> r;
  int local_bc;
  float pixel [3];
  PtexPtr<Ptex::v2_2::PtexCache> c;
  String error;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  c._ptr = Ptex::v2_2::PtexCache::create(0,0,false,(PtexInputHandler *)0x0,(PtexErrorHandler *)0x0);
  (*(c._ptr)->_vptr_PtexCache[3])(c._ptr,"foo/bar:.");
  iVar2 = (*(c._ptr)->_vptr_PtexCache[5])(c._ptr,"test.ptx",&error);
  r._ptr = (PtexTexture *)CONCAT44(extraout_var,iVar2);
  local_bc = 1;
  if (r._ptr == (PtexTexture *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,error._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"meshType: ");
    mt = (*(r._ptr)->_vptr_PtexTexture[5])();
    pcVar8 = Ptex::v2_2::MeshTypeName(mt);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"dataType: ");
    DVar3 = (*(r._ptr)->_vptr_PtexTexture[6])();
    pcVar8 = Ptex::v2_2::DataTypeName(DVar3);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"numChannels: ");
    iVar2 = (*(r._ptr)->_vptr_PtexTexture[0xb])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<((ostream *)&std::cout,"alphaChannel: ");
    iVar2 = (*(r._ptr)->_vptr_PtexTexture[10])();
    if (iVar2 == -1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"(none)");
    }
    else {
      iVar2 = (*(r._ptr)->_vptr_PtexTexture[10])();
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    }
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"numFaces: ");
    iVar2 = (*(r._ptr)->_vptr_PtexTexture[0xc])();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar2 = (*(r._ptr)->_vptr_PtexTexture[0xf])();
    meta = (PtexMetaData *)CONCAT44(extraout_var_00,iVar2);
    poVar7 = std::operator<<((ostream *)&std::cout,"numMetaKeys: ");
    iVar2 = (*meta->_vptr_PtexMetaData[3])(meta);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar2 = (*meta->_vptr_PtexMetaData[3])(meta);
    if (iVar2 != 0) {
      DumpMetaData(meta);
    }
    (*meta->_vptr_PtexMetaData[2])(meta);
    uVar4 = (*(r._ptr)->_vptr_PtexTexture[0xc])();
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
      iVar2 = (*(r._ptr)->_vptr_PtexTexture[0x10])(r._ptr,(ulong)uVar10);
      puVar9 = (ushort *)CONCAT44(extraout_var_01,iVar2);
      poVar7 = std::operator<<((ostream *)&std::cout,"face ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar10);
      poVar7 = std::operator<<(poVar7,":\n");
      poVar7 = std::operator<<(poVar7,"  res: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)(char)*puVar9);
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)*(char *)((long)puVar9 + 1));
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"  adjface: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)(puVar9 + 2));
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)(puVar9 + 4));
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)(puVar9 + 6));
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)(puVar9 + 8));
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"  adjedge: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(byte)puVar9[1] & 3);
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(byte)((byte)puVar9[1] >> 2) & 3);
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(byte)((byte)puVar9[1] >> 4) & 3);
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)(byte)((byte)puVar9[1] >> 6));
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"  flags: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)*(byte *)((long)puVar9 + 3));
      std::operator<<(poVar7,"\n");
      uVar1 = *puVar9;
      uVar12 = (uint)uVar1;
      uVar5 = (*(r._ptr)->_vptr_PtexTexture[6])();
      iVar2 = *(int *)(Ptex::v2_2::DataSize(Ptex::v2_2::DataType)::sizes + (ulong)uVar5 * 4);
      iVar6 = (*(r._ptr)->_vptr_PtexTexture[0xb])();
      uVar5 = (uint)(uVar1 >> 8);
      data = malloc((long)(iVar2 * iVar6 *
                          ((1 << ((byte)uVar1 & 0x1f)) << ((byte)(uVar1 >> 8) & 0x1f))));
      while( true ) {
        cVar11 = (char)uVar12;
        cVar13 = (char)uVar5;
        if ((cVar11 < '\x01') && (cVar13 < '\x01')) break;
        uVar5 = uVar5 << 8 | uVar12 & 0xff;
        (*(r._ptr)->_vptr_PtexTexture[0x12])(r._ptr,(ulong)uVar10,data,0,(ulong)uVar5);
        DVar3 = (*(r._ptr)->_vptr_PtexTexture[6])();
        iVar2 = (*(r._ptr)->_vptr_PtexTexture[0xb])();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"  ",(allocator<char> *)pixel);
        DumpData(SUB42(uVar5,0),DVar3,iVar2,data,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        uVar12 = (uint)(byte)(cVar11 - 1);
        if (cVar11 == '\0') {
          uVar12 = 0;
        }
        uVar5 = (uint)(byte)(cVar13 - 1);
        if (cVar13 == '\0') {
          uVar5 = 0;
        }
      }
      (*(r._ptr)->_vptr_PtexTexture[0x12])(r._ptr,(ulong)uVar10,data,0,0);
      DVar3 = (*(r._ptr)->_vptr_PtexTexture[6])();
      iVar2 = (*(r._ptr)->_vptr_PtexTexture[0xb])();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"  ",(allocator<char> *)pixel);
      DumpData((Res)((ushort)(uVar5 << 8) | (ushort)(uVar12 & 0xff)),DVar3,iVar2,data,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      free(data);
      pixel[0] = -1.0;
      pixel[1] = -1.0;
      pixel[2] = -1.0;
      (*(r._ptr)->_vptr_PtexTexture[0x15])(r._ptr,(ulong)uVar10,1,1,pixel,3,3);
      if ((pixel[0] != 0.0) || (NAN(pixel[0]))) {
LAB_00111047:
        poVar7 = std::operator<<((ostream *)&std::cerr,"pixel should be zero");
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00111062;
      }
      if ((((pixel[1] != 0.0) || (NAN(pixel[1]))) || (pixel[2] != 0.0)) || (NAN(pixel[2])))
      goto LAB_00111047;
    }
    local_bc = 0;
  }
LAB_00111062:
  Ptex::v2_2::PtexPtr<Ptex::v2_2::PtexTexture>::~PtexPtr(&r);
  Ptex::v2_2::PtexPtr<Ptex::v2_2::PtexCache>::~PtexPtr(&c);
  std::__cxx11::string::~string((string *)&error);
  return local_bc;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
    Ptex::String error;
    PtexPtr<PtexCache> c(PtexCache::create(0,0));
    c->setSearchPath("foo/bar:.");
    PtexPtr<PtexTexture> r(c->get("test.ptx", error));

    if (!r) {
        std::cerr << error.c_str() << std::endl;
        return 1;
    }
    std::cout << "meshType: " << Ptex::MeshTypeName(r->meshType()) << std::endl;
    std::cout << "dataType: " << Ptex::DataTypeName(r->dataType()) << std::endl;
    std::cout << "numChannels: " << r->numChannels() << std::endl;
    std::cout << "alphaChannel: ";
    if (r->alphaChannel() == -1) std::cout << "(none)" << std::endl;
    else std::cout << r->alphaChannel() << std::endl;
    std::cout << "numFaces: " << r->numFaces() << std::endl;

    PtexMetaData* meta = r->getMetaData();
    std::cout << "numMetaKeys: " << meta->numKeys() << std::endl;
    if (meta->numKeys()) DumpMetaData(meta);
    meta->release();

    int nfaces = r->numFaces();
    for (int i = 0; i < nfaces; i++) {
        const Ptex::FaceInfo& f = r->getFaceInfo(i);
        std::cout << "face " << i << ":\n"
                  << "  res: " << int(f.res.ulog2) << ' ' << int(f.res.vlog2) << "\n"
                  << "  adjface: " 
                  << f.adjfaces[0] << ' '
                  << f.adjfaces[1] << ' '
                  << f.adjfaces[2] << ' '
                  << f.adjfaces[3] << "\n"
                  << "  adjedge: " 
                  << f.adjedge(0) << ' '
                  << f.adjedge(1) << ' '
                  << f.adjedge(2) << ' '
                  << f.adjedge(3) << "\n"
                  << "  flags: " << int(f.flags) << "\n";

        Ptex::Res res = f.res;
        void* data = malloc(Ptex::DataSize(r->dataType()) * r->numChannels() * res.size());
        while (res.ulog2 > 0 || res.vlog2 > 0) {
            r->getData(i, data, 0, res);
            DumpData(res, r->dataType(), r->numChannels(), data, "  ");
            if (res.ulog2) res.ulog2--;
            if (res.vlog2) res.vlog2--;
        }
        r->getData(i, data, 0, Ptex::Res(0,0));
        DumpData(res, r->dataType(), r->numChannels(), data, "  ");
        free(data);

        // Read more channels than are available.
        // This should wipe pixel with zeroes and nothing more.
        float pixel[] = {-1.0f, -1.0f, -1.0f};
        r->getPixel(i, 1, 1, pixel, 3, 3);
        if (pixel[0] != 0.0f || pixel[1] != 0.0f || pixel[2] != 0.0f) {
                std::cerr << "pixel should be zero" << std::endl;
                return 1;
        }
    }

    return 0;
}